

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPointToArcTangents.cpp
# Opt level: O2

bool ParseTestPointToArcTangents(string *sString)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __a;
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  double dVar6;
  LLPoint tanPt1;
  string sTestId;
  LLPoint pt;
  string sTan2Lat;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_438;
  string sTanPt1Lat;
  LLPoint tanPt2;
  string sTanPt2Lon;
  string sTanPt2Lat;
  string sTanPt1Lon;
  LLPoint arc;
  int sub_matches [10];
  string sArcRadius;
  string sArcCenterLon;
  string sArcCenterLat;
  string sPointLon;
  string sPointLat;
  sregex_token_iterator it;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  double local_1a0;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  sregex_token_iterator s_end;
  
  trim(sString," \t\n\r\f\v");
  sTestId._M_dataplus._M_p = (pointer)&sTestId.field_2;
  sTestId._M_string_length = 0;
  sTestId.field_2._M_local_buf[0] = '\0';
  sPointLat._M_dataplus._M_p = (pointer)&sPointLat.field_2;
  sPointLat._M_string_length = 0;
  sPointLon._M_dataplus._M_p = (pointer)&sPointLon.field_2;
  sPointLon._M_string_length = 0;
  sPointLat.field_2._M_local_buf[0] = '\0';
  sPointLon.field_2._M_local_buf[0] = '\0';
  sArcCenterLat._M_dataplus._M_p = (pointer)&sArcCenterLat.field_2;
  sArcCenterLat._M_string_length = 0;
  sArcCenterLon._M_dataplus._M_p = (pointer)&sArcCenterLon.field_2;
  sArcCenterLon._M_string_length = 0;
  sArcCenterLat.field_2._M_local_buf[0] = '\0';
  sArcCenterLon.field_2._M_local_buf[0] = '\0';
  sArcRadius._M_dataplus._M_p = (pointer)&sArcRadius.field_2;
  sArcRadius._M_string_length = 0;
  sTanPt1Lat._M_dataplus._M_p = (pointer)&sTanPt1Lat.field_2;
  sTanPt1Lat._M_string_length = 0;
  sArcRadius.field_2._M_local_buf[0] = '\0';
  sTanPt1Lat.field_2._M_local_buf[0] = '\0';
  sTanPt1Lon._M_dataplus._M_p = (pointer)&sTanPt1Lon.field_2;
  sTanPt1Lon._M_string_length = 0;
  sTanPt2Lat._M_dataplus._M_p = (pointer)&sTanPt2Lat.field_2;
  sTanPt2Lat._M_string_length = 0;
  sTanPt1Lon.field_2._M_local_buf[0] = '\0';
  sTanPt2Lat.field_2._M_local_buf[0] = '\0';
  sTanPt2Lon._M_dataplus._M_p = (pointer)&sTanPt2Lon.field_2;
  sTanPt2Lon._M_string_length = 0;
  sTanPt2Lon.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&pt,"([a-zA-Z]*\\d*)[,]",(allocator *)&it);
  std::__cxx11::string::append((char *)&pt);
  std::__cxx11::string::append((char *)&pt);
  std::__cxx11::string::append((char *)&pt);
  std::__cxx11::string::append((char *)&pt);
  std::__cxx11::string::append((char *)&pt);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&arc,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pt,0x11);
  sub_matches[4] = 5;
  sub_matches[5] = 6;
  sub_matches[6] = 7;
  sub_matches[7] = 8;
  sub_matches[0] = 1;
  sub_matches[1] = 2;
  sub_matches[2] = 3;
  sub_matches[3] = 4;
  sub_matches[8] = 9;
  sub_matches[9] = 10;
  __a._M_current = (sString->_M_dataplus)._M_p;
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<10ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)&it,__a,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__a._M_current + sString->_M_string_length),(regex_type *)&arc,&sub_matches,0);
  s_end._M_suffix.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current._0_1_ = 0;
  s_end._M_suffix._9_8_ = 0;
  s_end._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  s_end._M_suffix.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current._0_1_ = 0;
  s_end._M_suffix.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current._1_7_ = 0;
  s_end._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  s_end._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  s_end._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  s_end._M_position._M_match._M_begin._M_current = (char *)0x0;
  s_end._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  s_end._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s_end._M_position._M_pregex = (regex_type *)0x0;
  s_end._M_position._M_flags = 0;
  s_end._M_position._28_4_ = 0;
  s_end._M_position._M_begin._M_current = (char *)0x0;
  s_end._M_position._M_end._M_current = (char *)0x0;
  s_end._M_n = 0;
  s_end._M_result = (value_type *)0x0;
  s_end._M_has_m1 = false;
  bVar3 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=(&it,&s_end);
  if (bVar3) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sTan2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&tanPt1,local_438);
    std::__cxx11::string::operator=((string *)&sTestId,(string *)&tanPt1);
    std::__cxx11::string::~string((string *)&tanPt1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sTan2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sTan2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&tanPt1,local_438);
    std::__cxx11::string::operator=((string *)&sPointLat,(string *)&tanPt1);
    std::__cxx11::string::~string((string *)&tanPt1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sTan2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sTan2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&tanPt1,local_438);
    std::__cxx11::string::operator=((string *)&sPointLon,(string *)&tanPt1);
    std::__cxx11::string::~string((string *)&tanPt1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sTan2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sTan2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&tanPt1,local_438);
    std::__cxx11::string::operator=((string *)&sArcCenterLat,(string *)&tanPt1);
    std::__cxx11::string::~string((string *)&tanPt1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sTan2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sTan2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&tanPt1,local_438);
    std::__cxx11::string::operator=((string *)&sArcCenterLon,(string *)&tanPt1);
    std::__cxx11::string::~string((string *)&tanPt1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sTan2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sTan2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&tanPt1,local_438);
    std::__cxx11::string::operator=((string *)&sArcRadius,(string *)&tanPt1);
    std::__cxx11::string::~string((string *)&tanPt1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sTan2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sTan2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&tanPt1,local_438);
    std::__cxx11::string::operator=((string *)&sTanPt1Lat,(string *)&tanPt1);
    std::__cxx11::string::~string((string *)&tanPt1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sTan2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sTan2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&tanPt1,local_438);
    std::__cxx11::string::operator=((string *)&sTanPt1Lon,(string *)&tanPt1);
    std::__cxx11::string::~string((string *)&tanPt1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sTan2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sTan2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&tanPt1,local_438);
    std::__cxx11::string::operator=((string *)&sTanPt2Lat,(string *)&tanPt1);
    std::__cxx11::string::~string((string *)&tanPt1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sTan2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sTan2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&tanPt1,local_438);
    std::__cxx11::string::operator=((string *)&sTanPt2Lon,(string *)&tanPt1);
    std::__cxx11::string::~string((string *)&tanPt1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sTan2Lat);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator(&s_end);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator(&it);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&arc);
  std::__cxx11::string::~string((string *)&pt);
  std::__cxx11::string::string((string *)&local_b8,(string *)&sPointLat);
  dVar1 = ParseLatitude(&local_b8);
  std::__cxx11::string::string((string *)&local_d8,(string *)&sPointLon);
  dVar2 = ParseLongitude(&local_d8);
  pt.latitude = dVar1 * 0.017453292519943295;
  pt.longitude = dVar2 * 0.017453292519943295;
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_f8,(string *)&sArcCenterLat);
  dVar1 = ParseLatitude(&local_f8);
  std::__cxx11::string::string((string *)&local_118,(string *)&sArcCenterLon);
  dVar2 = ParseLongitude(&local_118);
  arc.latitude = dVar1 * 0.017453292519943295;
  arc.longitude = dVar2 * 0.017453292519943295;
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  dVar1 = atof(sArcRadius._M_dataplus._M_p);
  iVar4 = std::__cxx11::string::compare((char *)&sTanPt1Lat);
  if (iVar4 != 0) {
    std::__cxx11::string::string((string *)&local_138,(string *)&sTanPt1Lat);
    ParseLatitude(&local_138);
    std::__cxx11::string::string((string *)&local_158,(string *)&sTanPt1Lon);
    ParseLongitude(&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::string((string *)&local_178,(string *)&sTanPt2Lat);
    ParseLatitude(&local_178);
    std::__cxx11::string::string((string *)&local_198,(string *)&sTanPt2Lon);
    ParseLongitude(&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
  }
  tanPt1.latitude = 0.0;
  tanPt1.longitude = 0.0;
  tanPt2.latitude = 0.0;
  tanPt2.longitude = 0.0;
  iVar4 = GeoCalcs::PointToArcTangents(&pt,&arc,dVar1 * 1852.0,&tanPt1,&tanPt2,1e-08);
  if (iVar4 == 0) {
    iVar4 = std::__cxx11::string::compare((char *)&sTanPt1Lat);
    if (iVar4 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"\n");
      poVar5 = std::operator<<(poVar5,(string *)&sTestId);
      std::operator<<(poVar5," Failed: Returned with no solution.");
      bVar3 = false;
    }
  }
  else {
    s_end._M_position._M_begin._M_current = (char *)(tanPt1.latitude * 57.29577951308232);
    ConvertLatitudeDdToDms_abi_cxx11_((string *)&it,(double *)&s_end);
    sTan2Lat._M_dataplus._M_p = (pointer)(tanPt1.longitude * 57.29577951308232);
    ConvertLongitudeDdToDms_abi_cxx11_((string *)&s_end,(double *)&sTan2Lat);
    sub_matches._0_8_ = tanPt2.latitude * 57.29577951308232;
    ConvertLatitudeDdToDms_abi_cxx11_(&sTan2Lat,(double *)sub_matches);
    local_1a0 = tanPt2.longitude * 57.29577951308232;
    ConvertLongitudeDdToDms_abi_cxx11_((string *)sub_matches,&local_1a0);
    iVar4 = std::__cxx11::string::compare((string *)&it);
    if (iVar4 != 0) {
      std::__cxx11::string::string((string *)&local_1c0,(string *)&sTanPt1Lat);
      dVar1 = ParseLatitude(&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      dVar6 = ABS(dVar1 * 0.017453292519943295);
      dVar2 = ABS(tanPt1.latitude);
      if (dVar6 <= ABS(tanPt1.latitude)) {
        dVar2 = dVar6;
      }
      if (ABS(dVar1 * 0.017453292519943295 - tanPt1.latitude) <= dVar2 * 1e-10) {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&sTestId);
        std::operator<<(poVar5," within rounding tolerance of ");
        poVar5 = std::ostream::_M_insert<double>(1e-10);
        poVar5 = std::operator<<(poVar5,": Input Tangent pt 1 latitude: ");
        poVar5 = std::operator<<(poVar5,(string *)&sTanPt1Lat);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)&it);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&sTestId);
        poVar5 = std::operator<<(poVar5," failed: Expected Tangent pt 1 latitude: ");
        poVar5 = std::operator<<(poVar5,(string *)&sTanPt1Lat);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)&it);
        bVar3 = false;
      }
    }
    iVar4 = std::__cxx11::string::compare((string *)&s_end);
    if (iVar4 != 0) {
      std::__cxx11::string::string((string *)&local_1e0,(string *)&sTanPt1Lon);
      dVar1 = ParseLongitude(&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      dVar6 = ABS(dVar1 * 0.017453292519943295);
      dVar2 = ABS(tanPt1.longitude);
      if (dVar6 <= ABS(tanPt1.longitude)) {
        dVar2 = dVar6;
      }
      if (ABS(dVar1 * 0.017453292519943295 - tanPt1.longitude) <= dVar2 * 1e-10) {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&sTestId);
        std::operator<<(poVar5," within rounding tolerance of ");
        poVar5 = std::ostream::_M_insert<double>(1e-10);
        poVar5 = std::operator<<(poVar5,": Input Tangent pt 1 longitude: ");
        poVar5 = std::operator<<(poVar5,(string *)&sTanPt1Lon);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)&s_end);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&sTestId);
        poVar5 = std::operator<<(poVar5," failed: Expected Tangent pt 1 longitude: ");
        poVar5 = std::operator<<(poVar5,(string *)&sTanPt1Lon);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)&s_end);
        bVar3 = false;
      }
    }
    iVar4 = std::__cxx11::string::compare((string *)&sTan2Lat);
    if (iVar4 != 0) {
      std::__cxx11::string::string((string *)&local_200,(string *)&sTanPt2Lat);
      dVar1 = ParseLatitude(&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      dVar6 = ABS(dVar1 * 0.017453292519943295);
      dVar2 = ABS(tanPt2.latitude);
      if (dVar6 <= ABS(tanPt2.latitude)) {
        dVar2 = dVar6;
      }
      if (ABS(dVar1 * 0.017453292519943295 - tanPt2.latitude) <= dVar2 * 1e-10) {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&sTestId);
        std::operator<<(poVar5," within rounding tolerance of ");
        poVar5 = std::ostream::_M_insert<double>(1e-10);
        poVar5 = std::operator<<(poVar5,": Input Tangent pt 2 latitude: ");
        poVar5 = std::operator<<(poVar5,(string *)&sTanPt2Lat);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)&sTan2Lat);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&sTestId);
        poVar5 = std::operator<<(poVar5," failed: Expected Tangent pt 2 latitude: ");
        poVar5 = std::operator<<(poVar5,(string *)&sTanPt2Lat);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)&sTan2Lat);
        bVar3 = false;
      }
    }
    iVar4 = std::__cxx11::string::compare((string *)sub_matches);
    if (iVar4 != 0) {
      std::__cxx11::string::string((string *)&local_220,(string *)&sTanPt2Lon);
      dVar1 = ParseLongitude(&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      dVar6 = ABS(dVar1 * 0.017453292519943295);
      dVar2 = ABS(tanPt2.longitude);
      if (dVar6 <= ABS(tanPt2.longitude)) {
        dVar2 = dVar6;
      }
      if (ABS(dVar1 * 0.017453292519943295 - tanPt2.longitude) <= dVar2 * 1e-10) {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&sTestId);
        std::operator<<(poVar5," within rounding tolerance of ");
        poVar5 = std::ostream::_M_insert<double>(1e-10);
        poVar5 = std::operator<<(poVar5,": Input Tangent pt 2 longitude: ");
        poVar5 = std::operator<<(poVar5,(string *)&sTanPt2Lon);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)sub_matches);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&sTestId);
        poVar5 = std::operator<<(poVar5," failed: Expected Tangent pt 2 longitude: ");
        poVar5 = std::operator<<(poVar5,(string *)&sTanPt2Lon);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)sub_matches);
        bVar3 = false;
      }
    }
    std::__cxx11::string::~string((string *)sub_matches);
    std::__cxx11::string::~string((string *)&sTan2Lat);
    std::__cxx11::string::~string((string *)&s_end);
    std::__cxx11::string::~string((string *)&it);
  }
  std::__cxx11::string::~string((string *)&sTanPt2Lon);
  std::__cxx11::string::~string((string *)&sTanPt2Lat);
  std::__cxx11::string::~string((string *)&sTanPt1Lon);
  std::__cxx11::string::~string((string *)&sTanPt1Lat);
  std::__cxx11::string::~string((string *)&sArcRadius);
  std::__cxx11::string::~string((string *)&sArcCenterLon);
  std::__cxx11::string::~string((string *)&sArcCenterLat);
  std::__cxx11::string::~string((string *)&sPointLon);
  std::__cxx11::string::~string((string *)&sPointLat);
  std::__cxx11::string::~string((string *)&sTestId);
  return bVar3;
}

Assistant:

bool ParseTestPointToArcTangents(string sString)
{
    bool bPassed = false;
    trim(sString);
    string sTestId, sPointLat, sPointLon, sArcCenterLat, sArcCenterLon, sArcRadius;
    string sTanPt1Lat, sTanPt1Lon, sTanPt2Lat, sTanPt2Lon;
    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-zA-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])";

        regex pat(sRxPat, flags);

        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sTestId = *it++;
            sPointLat = *it++;
            sPointLon = *it++;
            sArcCenterLat = *it++;
            sArcCenterLon = *it++;
            sArcRadius = *it++;
            sTanPt1Lat = *it++;
            sTanPt1Lon = *it++;
            sTanPt2Lat = *it++;
            sTanPt2Lon = *it++;
            bPassed = true;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }

    LLPoint pt(Deg2Rad(ParseLatitude(sPointLat)), Deg2Rad(ParseLongitude(sPointLon)));
    LLPoint arc(Deg2Rad(ParseLatitude(sArcCenterLat)), Deg2Rad(ParseLongitude(sArcCenterLon)));
    double radius = NmToMeters(atof(sArcRadius.c_str()));

    LLPoint tangentPt1;
    LLPoint tangentPt2;

    if (sTanPt1Lat.compare("N/A") != 0)
    {
        tangentPt1.Set(Deg2Rad(ParseLatitude(sTanPt1Lat)), Deg2Rad(ParseLongitude(sTanPt1Lon)));
        tangentPt2.Set(Deg2Rad(ParseLatitude(sTanPt2Lat)), Deg2Rad(ParseLongitude(sTanPt2Lon)));
    }

    LLPoint tanPt1, tanPt2;

    int nIndex = PointToArcTangents(pt, arc, radius, tanPt1, tanPt2, 1e-8);

    if (nIndex == 0)
    {
        if (sTanPt1Lat.compare("N/A") != 0)
        {
            bPassed = false;
            cout << "\n" << sTestId << " Failed: Returned with no solution.";
        }

    }
    else
    {

        string sTan1Lat = ConvertLatitudeDdToDms(Rad2Deg(tanPt1.latitude));
        string sTan1Lon = ConvertLongitudeDdToDms(Rad2Deg(tanPt1.longitude));
        string sTan2Lat = ConvertLatitudeDdToDms(Rad2Deg(tanPt2.latitude));
        string sTan2Lon = ConvertLongitudeDdToDms(Rad2Deg(tanPt2.longitude));

        double dTol = 1e-10;
        if (sTan1Lat.compare(sTanPt1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sTanPt1Lat));
            if (IsApprox(dLat, tanPt1.latitude, dTol))
            {
                cout << "\n" << sTestId << " within rounding tolerance of " << dTol <<
                ": Input Tangent pt 1 latitude: " << sTanPt1Lat << "  calced: " << sTan1Lat;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tangent pt 1 latitude: " << sTanPt1Lat << "  calced: " <<
                sTan1Lat;
                bPassed = false;
            }
        }

        if (sTan1Lon.compare(sTanPt1Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sTanPt1Lon));
            if (IsApprox(dLon, tanPt1.longitude, dTol))
            {
                cout << "\n" << sTestId << " within rounding tolerance of " << dTol <<
                ": Input Tangent pt 1 longitude: " << sTanPt1Lon << "  calced: " << sTan1Lon;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tangent pt 1 longitude: " << sTanPt1Lon << "  calced: " <<
                sTan1Lon;
                bPassed = false;
            }
        }

        if (sTan2Lat.compare(sTanPt2Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sTanPt2Lat));
            if (IsApprox(dLat, tanPt2.latitude, dTol))
            {
                cout << "\n" << sTestId << " within rounding tolerance of " << dTol <<
                ": Input Tangent pt 2 latitude: " << sTanPt2Lat << "  calced: " << sTan2Lat;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tangent pt 2 latitude: " << sTanPt2Lat << "  calced: " <<
                sTan2Lat;
                bPassed = false;
            }
        }

        if (sTan2Lon.compare(sTanPt2Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sTanPt2Lon));
            if (IsApprox(dLon, tanPt2.longitude, dTol))
            {
                cout << "\n" << sTestId << " within rounding tolerance of " << dTol <<
                ": Input Tangent pt 2 longitude: " << sTanPt2Lon << "  calced: " << sTan2Lon;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tangent pt 2 longitude: " << sTanPt2Lon << "  calced: " <<
                sTan2Lon;
                bPassed = false;
            }
        }


    }


    return bPassed;
}